

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnGetGlobalExpr(BinaryReaderIR *this,Index global_index)

{
  char *__s;
  Offset OVar1;
  Result RVar2;
  size_t sVar3;
  undefined1 auStack_a8 [8];
  Location loc;
  Var local_80;
  _Head_base<0UL,_wabt::Expr_*,_false> local_38;
  Expr *local_30;
  
  loc.filename.size_._0_4_ = 0;
  loc.filename.size_._4_4_ = 0;
  loc.field_1.field_0.line = 0;
  auStack_a8 = (undefined1  [8])0x0;
  loc.filename.data_._0_4_ = 0;
  loc.filename.data_._4_4_ = 0;
  __s = this->filename_;
  sVar3 = strlen(__s);
  loc.filename.data_._0_4_ = (undefined4)sVar3;
  loc.filename.data_._4_4_ = (undefined4)(sVar3 >> 0x20);
  OVar1 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  loc.filename.size_._0_4_ = (undefined4)OVar1;
  loc.filename.size_._4_4_ = (undefined4)(OVar1 >> 0x20);
  auStack_a8 = (undefined1  [8])__s;
  Var::Var(&local_80,global_index,(Location *)auStack_a8);
  MakeUnique<wabt::VarExpr<(wabt::ExprType)17>,wabt::Var>((wabt *)&local_30,&local_80);
  local_38._M_head_impl = local_30;
  local_30 = (Expr *)0x0;
  RVar2 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_38);
  if (local_38._M_head_impl != (Expr *)0x0) {
    (*(local_38._M_head_impl)->_vptr_Expr[1])();
  }
  local_38._M_head_impl = (Expr *)0x0;
  if (local_30 != (Expr *)0x0) {
    (**(code **)(*(long *)local_30 + 8))();
  }
  local_30 = (Expr *)0x0;
  Var::~Var(&local_80);
  return (Result)RVar2.enum_;
}

Assistant:

Result BinaryReaderIR::OnGetGlobalExpr(Index global_index) {
  return AppendExpr(
      MakeUnique<GetGlobalExpr>(Var(global_index, GetLocation())));
}